

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solution-graph.hxx
# Opt level: O2

void __thiscall
lineage::SolutionGraph::SolutionGraph
          (SolutionGraph *this,ProblemGraph *problemGraph,Solution *solution)

{
  Graph *graph;
  pointer pvVar1;
  long lVar2;
  Index element;
  pointer puVar3;
  size_t vertexIndex0;
  size_t vertexIndex1;
  _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
  *this_00;
  _Base_ptr p_Var4;
  pointer pRVar5;
  ulong uVar6;
  ulong uVar7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  size_t j;
  ulong uVar8;
  pointer pAVar9;
  _Rb_tree_header *p_Var10;
  map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
  descendants;
  Index v1Component;
  Index v0Component;
  SubgraphCutPerFrame subgraphCutPerFrame;
  ComponentLabeling componentsPerFrame;
  
  this->problemGraph_ = problemGraph;
  this->solution_ = solution;
  this_01 = &this->cellOfNode_;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (this_01,((long)(problemGraph->problem_->nodes).
                            super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(problemGraph->problem_->nodes).
                           super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl
                           .super__Vector_impl_data._M_start) / 0x18,
             (allocator_type *)&componentsPerFrame);
  (this->lineageGraph_).edges_.
  super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lineageGraph_).edges_.
  super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lineageGraph_).vertices_.
  super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lineageGraph_).edges_.
  super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lineageGraph_).vertices_.
  super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lineageGraph_).vertices_.
  super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lineageGraph_).multipleEdgesEnabled_ = false;
  (this->nodesOfCell_).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodesOfCell_).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nodesOfCell_).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  validate(problemGraph,solution);
  subgraphCutPerFrame.problem_ = this->problemGraph_->problem_;
  subgraphCutPerFrame.edgeLabels_ = &solution->edge_labels;
  andres::graph::
  ComponentsByPartition<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>_>::
  ComponentsByPartition(&componentsPerFrame);
  graph = &problemGraph->graph_;
  andres::graph::
  ComponentsByPartition<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>>::
  build<lineage::ProblemGraph::SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((ComponentsByPartition<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>>
              *)&componentsPerFrame,graph,&subgraphCutPerFrame);
  uVar6 = 0;
  while (p_Var10 = &descendants._M_t._M_impl.super__Rb_tree_header,
        uVar6 < problemGraph->numberOfFrames_ - 1) {
    descendants._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    descendants._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    descendants._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    uVar8 = 0;
    descendants._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var10->_M_header;
    descendants._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var10->_M_header;
    for (; pvVar1 = (problemGraph->nodeIndicesInFrame_).
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
        lVar2 = *(long *)&pvVar1[uVar6].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data,
        uVar8 < (ulong)((long)*(pointer *)
                               ((long)&pvVar1[uVar6].
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data + 8) - lVar2 >> 3);
        uVar8 = uVar8 + 1) {
      element = *(Index *)(lVar2 + uVar8 * 8);
      v0Component = andres::Partition<unsigned_long>::find(&componentsPerFrame.partition_,element);
      pRVar5 = (graph->vertices_).
               super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (pAVar9 = *(pointer *)
                     &pRVar5[element].vector_.
                      super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
          ; pAVar9 != *(pointer *)
                       ((long)&pRVar5[element].vector_.
                               super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                       + 8); pAVar9 = pAVar9 + 1) {
        if ((uVar6 + 1 ==
             (long)*(int *)((long)(this->problemGraph_->problem_->nodes).
                                  super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
                                  _M_impl.super__Vector_impl_data._M_start + pAVar9->vertex_ * 0x18)
            ) && ((solution->edge_labels).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start[pAVar9->edge_] == '\0')) {
          v1Component = andres::Partition<unsigned_long>::find
                                  (&componentsPerFrame.partition_,pAVar9->vertex_);
          this_00 = (_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                     *)std::
                       map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                       ::operator[](&descendants,&v0Component);
          std::
          _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
          ::_M_insert_unique<unsigned_long_const&>(this_00,&v1Component);
          pRVar5 = (graph->vertices_).
                   super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        }
      }
    }
    for (p_Var4 = descendants._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &descendants._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      if (p_Var4[2]._M_left == (_Base_ptr)0x1) {
        andres::Partition<unsigned_long>::merge
                  (&componentsPerFrame.partition_,*(Index *)(p_Var4 + 1),
                   *(Index *)(*(long *)(p_Var4 + 2) + 0x20));
      }
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
    ::~_Rb_tree(&descendants._M_t);
    uVar6 = uVar6 + 1;
  }
  andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::insertVertices
            (&this->lineageGraph_,componentsPerFrame.partition_.numberOfSets_);
  andres::Partition<unsigned_long>::
  elementLabeling<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            (&componentsPerFrame.partition_,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(this_01->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(&this->nodesOfCell_,
           (long)(this->lineageGraph_).vertices_.
                 super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->lineageGraph_).vertices_.
                 super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 6);
  descendants._M_t._M_impl._0_8_ = 0;
  while( true ) {
    puVar3 = (this->cellOfNode_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->cellOfNode_).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar3 >> 3) <=
        (ulong)descendants._M_t._M_impl._0_8_) break;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((this->nodesOfCell_).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + puVar3[descendants._M_t._M_impl._0_8_],
               (value_type_conflict *)&descendants);
    descendants._M_t._M_impl._0_8_ = descendants._M_t._M_impl._0_8_ + 1;
  }
  uVar6 = 0;
  while (uVar8 = uVar6, uVar8 < problemGraph->numberOfFrames_ - 1) {
    for (uVar7 = 0;
        pvVar1 = (problemGraph->nodeIndicesInFrame_).
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        lVar2 = *(long *)&pvVar1[uVar8].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data, uVar6 = uVar8 + 1,
        uVar7 < (ulong)((long)*(pointer *)
                               ((long)&pvVar1[uVar8].
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data + 8) - lVar2 >> 3);
        uVar7 = uVar7 + 1) {
      lVar2 = *(long *)(lVar2 + uVar7 * 8);
      pRVar5 = (graph->vertices_).
               super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (pAVar9 = *(pointer *)
                     &pRVar5[lVar2].vector_.
                      super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
          ; pAVar9 != *(pointer *)
                       ((long)&pRVar5[lVar2].vector_.
                               super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                       + 8); pAVar9 = pAVar9 + 1) {
        if ((uVar8 + 1 ==
             (long)*(int *)((long)(this->problemGraph_->problem_->nodes).
                                  super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
                                  _M_impl.super__Vector_impl_data._M_start + pAVar9->vertex_ * 0x18)
            ) && ((solution->edge_labels).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start[pAVar9->edge_] == '\0')) {
          puVar3 = (this_01->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          vertexIndex0 = puVar3[lVar2];
          vertexIndex1 = puVar3[pAVar9->vertex_];
          if (vertexIndex0 != vertexIndex1) {
            andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::insertEdge
                      (&this->lineageGraph_,vertexIndex0,vertexIndex1);
            pRVar5 = (graph->vertices_).
                     super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          }
        }
      }
    }
  }
  andres::Partition<unsigned_long>::~Partition(&componentsPerFrame.partition_);
  return;
}

Assistant:

SolutionGraph(const ProblemGraph& problemGraph, const Solution& solution) :
        problemGraph_(problemGraph),
        solution_(solution),
        cellOfNode_(problemGraph.problem().nodes.size())
    {
        typedef andres::graph::ComponentsByPartition<Graph> ComponentLabeling;
        typedef ProblemGraph::SubgraphWithoutCutAndInterFrameEdges<Solution::EdgeLabels> SubgraphCutPerFrame;

        validate(problemGraph, solution);

        SubgraphCutPerFrame subgraphCutPerFrame(problem(), solution.edge_labels);
        ComponentLabeling componentsPerFrame;
        componentsPerFrame.build(problemGraph.graph(), subgraphCutPerFrame);

        // join components c0 (at time t) and c1 (at time t+1) iff
        // c1 is the unique descendant of c0
        for (size_t frame = 0; frame < problemGraph.numberOfFrames() - 1; ++frame)
        {
            std::map<size_t, std::set<size_t>> descendants;
            for (size_t j = 0; j < problemGraph.numberOfNodesInFrame(frame); ++j)
            {
                auto v0 = problemGraph.nodeInFrame(frame, j);
                auto v0Component = componentsPerFrame.partition_.find(v0);
                
                for (auto it = problemGraph.graph().adjacenciesFromVertexBegin(v0);
                    it != problemGraph.graph().adjacenciesFromVertexEnd(v0); ++it)
                {
                    auto v1 = it->vertex();

                    if (problem().nodes[v1].t == frame + 1 && solution.edge_labels[it->edge()] == 0)
                    {
                        auto v1Component = componentsPerFrame.partition_.find(v1);

                        descendants[v0Component].insert(v1Component);
                    }
                }
            }

            for (auto& p: descendants)
                if (p.second.size() == 1)
                {
                    auto v0Component = p.first;
                    auto v1Component = *(p.second.begin());

                    componentsPerFrame.partition_.merge(v0Component, v1Component);
                }
        }

        lineageGraph_.insertVertices(componentsPerFrame.partition_.numberOfSets());
        // from now on, member function numberOfCells works

        componentsPerFrame.partition_.elementLabeling(cellOfNode_.begin());

        nodesOfCell_.resize(numberOfCells());
        for (size_t v = 0; v < numberOfNodes(); ++v)
            nodesOfCell_[cellOfNode_[v]].push_back(v);

        for (size_t frame = 0; frame < problemGraph.numberOfFrames() - 1; ++frame)
            for (size_t j = 0; j < problemGraph.numberOfNodesInFrame(frame); ++j)
            {
                auto v0 = problemGraph.nodeInFrame(frame, j);

                for (auto it = problemGraph.graph().adjacenciesFromVertexBegin(v0);
                    it != problemGraph.graph().adjacenciesFromVertexEnd(v0); ++it)
                {
                    auto v1 = it->vertex();

                    if (problem().nodes[v1].t == frame + 1 && solution.edge_labels[it->edge()] == 0)
                    {
                        auto c0 = cellOfNode_[v0];
                        auto c1 = cellOfNode_[v1];

                        if (c0 != c1)
                            lineageGraph_.insertEdge(c0, c1);
                    }
                }
            }
    }